

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O0

void mcsFile::WriteSectorHeader(ofstream *file,uint num)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  undefined8 uVar3;
  ostream *poVar4;
  void *this;
  unsigned_long csum_computed;
  uint num_local;
  ofstream *file_local;
  
  uVar3 = std::ostream::operator<<(file,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(uVar3,_Var1._M_c);
  std::ostream::operator<<(poVar4,std::uppercase);
  poVar4 = std::operator<<((ostream *)file,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
  std::operator<<(poVar4,"02000004");
  _Var2 = std::setw(4);
  poVar4 = std::operator<<((ostream *)file,_Var2);
  std::ostream::operator<<(poVar4,(ushort)num);
  _Var2 = std::setw(2);
  poVar4 = std::operator<<((ostream *)file,_Var2);
  this = (void *)std::ostream::operator<<
                           (poVar4,((ulong)((num & 0xff00) >> 8) + (ulong)(num & 0xff) + 6 ^
                                   0xffffffffffffffff) + 1 & 0xff);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void mcsFile::WriteSectorHeader(std::ofstream &file, unsigned int num)
{
    file << std::hex << std::setfill('0') << std::uppercase;
    file << ":" << std::hex << "02000004";
    unsigned long csum_computed = 0x02 + 0x04;
    file << std::setw(4) << static_cast<unsigned short>(num);
    csum_computed += num&0x000000ff;
    csum_computed += (num&0x0000ff00)>>8;
    csum_computed = (~csum_computed+1)&0x000000ff;
    file << std::setw(2) << csum_computed << std::endl;
}